

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visitConnectionEndpoint
          (QualifiedIdentifierResolver *this,SharedEndpoint *endpoint)

{
  size_t *psVar1;
  SharedEndpoint *pSVar2;
  Expression *pEVar3;
  bool bVar4;
  ProcessorBase *processor;
  ProcessorInstanceRef *pPVar5;
  pool_ptr<soul::AST::Expression> local_48;
  pool_ptr<soul::AST::ProcessorBase> local_40;
  pool_ref<soul::AST::Expression> local_38;
  pool_ref<soul::AST::Expression> local_30;
  
  pSVar2 = (this->currentConnectionEndpoint).object;
  (this->currentConnectionEndpoint).object = endpoint;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&endpoint->endpoint);
  local_30.object = (endpoint->endpoint).object;
  bVar4 = is_type<soul::AST::ProcessorRef,soul::AST::Expression>(&local_30);
  if (!bVar4) {
    local_38.object = (endpoint->endpoint).object;
    bVar4 = is_type<soul::AST::ProcessorBase,soul::AST::Expression>(&local_38);
    if (!bVar4) goto LAB_0024243f;
  }
  psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
            super_RewritingASTVisitor.itemsReplaced;
  *psVar1 = *psVar1 + 1;
  pEVar3 = (endpoint->endpoint).object;
  (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_40);
  processor = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_40);
  local_48.object = (Expression *)0x0;
  pPVar5 = getOrCreateImplicitProcessorInstance
                     (this,&(pEVar3->super_Statement).super_ASTObject.context,processor,&local_48);
  (endpoint->endpoint).object = &pPVar5->super_Expression;
LAB_0024243f:
  (this->currentConnectionEndpoint).object = pSVar2;
  return;
}

Assistant:

void visitConnectionEndpoint (AST::Connection::SharedEndpoint& endpoint)
        {
            auto oldEndpoint = currentConnectionEndpoint;
            currentConnectionEndpoint = endpoint;
            replaceExpression (endpoint.endpoint);

            if (is_type<AST::ProcessorRef> (endpoint.endpoint) || is_type<AST::ProcessorBase> (endpoint.endpoint))
            {
                ++itemsReplaced;
                endpoint.endpoint = getOrCreateImplicitProcessorInstance (endpoint.endpoint->context,
                                                                          *endpoint.endpoint->getAsProcessor(), {});
            }

            currentConnectionEndpoint = oldEndpoint;
        }